

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmpset.cpp
# Opt level: O0

void __thiscall
icu_63::BMPSet::BMPSet
          (BMPSet *this,BMPSet *otherBMPSet,int32_t *newParentList,int32_t newParentListLength)

{
  int32_t newParentListLength_local;
  int32_t *newParentList_local;
  BMPSet *otherBMPSet_local;
  BMPSet *this_local;
  
  this->_vptr_BMPSet = (_func_int **)&PTR__BMPSet_005cd410;
  this->containsFFFD = otherBMPSet->containsFFFD;
  this->list = newParentList;
  this->listLength = newParentListLength;
  memcpy(this->latin1Contains,otherBMPSet->latin1Contains,0x100);
  memcpy(this->table7FF,otherBMPSet->table7FF,0x100);
  memcpy(this->bmpBlockBits,otherBMPSet->bmpBlockBits,0x100);
  memcpy(this->list4kStarts,otherBMPSet->list4kStarts,0x48);
  return;
}

Assistant:

BMPSet::BMPSet(const BMPSet &otherBMPSet, const int32_t *newParentList, int32_t newParentListLength) :
        containsFFFD(otherBMPSet.containsFFFD),
        list(newParentList), listLength(newParentListLength) {
    uprv_memcpy(latin1Contains, otherBMPSet.latin1Contains, sizeof(latin1Contains));
    uprv_memcpy(table7FF, otherBMPSet.table7FF, sizeof(table7FF));
    uprv_memcpy(bmpBlockBits, otherBMPSet.bmpBlockBits, sizeof(bmpBlockBits));
    uprv_memcpy(list4kStarts, otherBMPSet.list4kStarts, sizeof(list4kStarts));
}